

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_8.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  byte *pbVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  ulong uVar11;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *palVar12;
  __m128i *palVar13;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *palVar14;
  char *pcVar15;
  uint uVar16;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar17;
  ulong uVar18;
  __m128i *palVar19;
  ulong uVar20;
  __m128i *palVar21;
  char *__format;
  int iVar22;
  int iVar23;
  int iVar24;
  __m128i *palVar25;
  int iVar26;
  long lVar27;
  __m128i *palVar28;
  __m128i *palVar29;
  char cVar30;
  char cVar31;
  char cVar36;
  char cVar39;
  char cVar41;
  char cVar44;
  char cVar46;
  char cVar49;
  byte bVar51;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  undefined1 auVar33 [16];
  byte bVar37;
  byte bVar42;
  byte bVar47;
  char cVar57;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  byte bVar58;
  char cVar65;
  byte bVar66;
  char cVar68;
  byte bVar69;
  char cVar71;
  char cVar72;
  byte bVar73;
  char cVar75;
  byte bVar76;
  byte bVar78;
  char cVar80;
  char cVar81;
  byte bVar82;
  char cVar84;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  byte bVar85;
  undefined1 auVar61 [16];
  char cVar67;
  char cVar70;
  char cVar74;
  char cVar77;
  char cVar79;
  char cVar83;
  char cVar86;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  byte bVar93;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  undefined1 auVar94 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  ulong uVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  char cVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  ulong uVar126;
  undefined1 auVar127 [16];
  char cVar128;
  char cVar138;
  ulong uVar129;
  char cVar132;
  char cVar133;
  char cVar134;
  char cVar135;
  char cVar136;
  char cVar137;
  char cVar139;
  char cVar140;
  char cVar141;
  char cVar142;
  char cVar143;
  char cVar144;
  char cVar145;
  undefined1 auVar130 [16];
  char cVar146;
  undefined1 auVar131 [16];
  ulong uVar147;
  undefined1 auVar148 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i *local_1d0;
  __m128i *local_1c8;
  __m128i *local_1c0;
  __m128i *local_1b8;
  __m128i *local_1b0;
  __m128i *local_1a8;
  __m128i *local_1a0;
  __m128i *local_198;
  undefined1 local_188 [16];
  ulong local_168;
  uint local_15c;
  undefined1 local_158 [16];
  __m128i *local_140;
  char local_130;
  undefined1 local_d8 [16];
  char cVar32;
  char cVar38;
  char cVar40;
  char cVar43;
  char cVar45;
  char cVar48;
  char cVar50;
  char cVar52;
  
  pcVar15 = profile->s1;
  ppVar3 = profile->matrix;
  result = parasail_sw_striped_profile_sse41_128_8(profile,s2,s2Len,open,gap);
  iVar9 = parasail_result_is_saturated(result);
  if (iVar9 != 0) {
    return result;
  }
  iVar9 = result->end_query;
  iVar2 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_8(pcVar15,iVar9 + 1,ppVar3);
  if (profile_00 == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar4 = (profile_00->profile8).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile8.score";
    }
    else {
      ppVar3 = profile_00->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar11 = (ulong)(uint)profile_00->s1Len;
        if (profile_00->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else if (iVar2 < 0) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar5 = (profile_00->profile8).matches;
            pvVar6 = (profile_00->profile8).similar;
            iVar10 = ppVar3->max;
            result_00 = parasail_result_new_stats();
            if (result_00 == (parasail_result_t *)0x0) {
              result_00 = (parasail_result_t *)0x0;
            }
            else {
              uVar20 = uVar11 + 0xf >> 4;
              result_00->flag = result_00->flag | 0x10110804;
              local_1d0 = parasail_memalign___m128i(0x10,uVar20);
              local_1b8 = parasail_memalign___m128i(0x10,uVar20);
              b = parasail_memalign___m128i(0x10,uVar20);
              local_1c0 = parasail_memalign___m128i(0x10,uVar20);
              local_198 = parasail_memalign___m128i(0x10,uVar20);
              local_1c8 = parasail_memalign___m128i(0x10,uVar20);
              palVar12 = parasail_memalign___m128i(0x10,uVar20);
              palVar13 = parasail_memalign___m128i(0x10,uVar20);
              b_00 = parasail_memalign___m128i(0x10,uVar20);
              b_01 = parasail_memalign___m128i(0x10,uVar20);
              b_02 = parasail_memalign___m128i(0x10,uVar20);
              b_03 = parasail_memalign___m128i(0x10,uVar20);
              local_1a0 = parasail_memalign___m128i(0x10,uVar20);
              local_1a8 = parasail_memalign___m128i(0x10,uVar20);
              local_1b0 = parasail_memalign___m128i(0x10,uVar20);
              palVar14 = parasail_memalign___m128i(0x10,uVar20);
              auVar33._0_8_ = -(ulong)(local_1d0 == (__m128i *)0x0);
              auVar33._8_8_ = -(ulong)(local_1b8 == (__m128i *)0x0);
              auVar116._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar116._8_8_ = -(ulong)(local_1c0 == (__m128i *)0x0);
              auVar33 = packssdw(auVar33,auVar116);
              auVar91._0_8_ = -(ulong)(local_198 == (__m128i *)0x0);
              auVar91._8_8_ = -(ulong)(local_1c8 == (__m128i *)0x0);
              auVar120._0_8_ = -(ulong)(palVar12 == (__m128i *)0x0);
              auVar120._8_8_ = -(ulong)(palVar13 == (__m128i *)0x0);
              auVar87 = packssdw(auVar91,auVar120);
              auVar33 = packssdw(auVar33,auVar87);
              auVar87._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar87._8_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar130._0_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar130._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar87 = packssdw(auVar87,auVar130);
              auVar122._0_8_ = -(ulong)(local_1a0 == (__m128i *)0x0);
              auVar122._8_8_ = -(ulong)(local_1a8 == (__m128i *)0x0);
              auVar59._0_8_ = -(ulong)(local_1b0 == (__m128i *)0x0);
              auVar59._8_8_ = -(ulong)(palVar14 == (__m128i *)0x0);
              auVar91 = packssdw(auVar122,auVar59);
              auVar87 = packssdw(auVar87,auVar91);
              auVar33 = packsswb(auVar33,auVar87);
              if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar33 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar33 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar33 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar33 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar33[0xf]) {
                local_188._8_8_ = local_188._0_8_;
                local_188._0_8_ = palVar14;
                local_168 = 0;
                auVar87 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
                auVar91 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
                c[1] = (longlong)local_1a8;
                c[0] = uVar20;
                palVar14 = b_02;
                parasail_memset___m128i(local_1d0,c,(size_t)b_02);
                c_00[1] = extraout_RDX;
                c_00[0] = uVar20;
                parasail_memset___m128i(b,c_00,(size_t)palVar14);
                c_01[1] = extraout_RDX_00;
                c_01[0] = uVar20;
                parasail_memset___m128i(local_198,c_01,(size_t)palVar14);
                c_02[1] = extraout_RDX_01;
                c_02[0] = uVar20;
                parasail_memset___m128i(palVar12,c_02,(size_t)palVar14);
                c_03[1] = extraout_RDX_02;
                c_03[0] = uVar20;
                parasail_memset___m128i(b_00,c_03,(size_t)palVar14);
                c_04[1] = extraout_RDX_03;
                c_04[0] = uVar20;
                parasail_memset___m128i(b_01,c_04,(size_t)palVar14);
                c_05[1] = extraout_RDX_04;
                c_05[0] = uVar20;
                parasail_memset___m128i(b_02,c_05,(size_t)palVar14);
                c_06[1] = extraout_RDX_05;
                c_06[0] = uVar20;
                parasail_memset___m128i(b_03,c_06,(size_t)palVar14);
                uVar8 = (uint)uVar20;
                uVar16 = uVar8 - 1;
                local_130 = (char)iVar10;
                local_15c = 0x80;
                uVar18 = 0;
                auVar33 = _DAT_008a1f40;
                local_158 = _DAT_008a1f40;
                local_d8 = _DAT_008a1f40;
                while( true ) {
                  palVar21 = local_1d0;
                  palVar25 = local_198;
                  palVar19 = b;
                  palVar14 = palVar12;
                  if (uVar18 == iVar2 + 1U) break;
                  uVar126 = palVar21[uVar16][0];
                  uVar119 = palVar19[uVar16][0];
                  uVar129 = palVar25[uVar16][0];
                  uVar147 = palVar14[uVar16][0];
                  auVar112._8_8_ = palVar21[uVar16][1] << 8 | uVar126 >> 0x38;
                  auVar114._8_8_ = palVar19[uVar16][1] << 8 | uVar119 >> 0x38;
                  auVar115._8_8_ = palVar25[uVar16][1] << 8 | uVar129 >> 0x38;
                  auVar110._8_8_ = palVar14[uVar16][1] << 8 | uVar147 >> 0x38;
                  auVar112._0_8_ = uVar126 << 8 | 0x80;
                  auVar114._0_8_ = uVar119 << 8 | 0x80;
                  auVar115._0_8_ = uVar129 << 8 | 0x80;
                  auVar110._0_8_ = uVar147 << 8 | 0x80;
                  lVar27 = (long)(int)(ppVar3->mapper[(byte)s2[uVar18]] * uVar8) * 0x10;
                  iVar10 = (int)uVar18 + -2;
                  local_198 = local_1c8;
                  local_140 = (__m128i *)local_188._0_8_;
                  if ((int)local_168 == iVar10) {
                    local_198 = local_1b0;
                    local_140 = palVar13;
                    palVar13 = (__m128i *)local_188._0_8_;
                  }
                  local_1d0 = local_1b8;
                  b = local_1c0;
                  if ((int)local_168 == iVar10) {
                    local_1d0 = local_1a0;
                    b = local_1a8;
                  }
                  auVar122 = _DAT_008a1f40;
                  auVar127 = _DAT_008a2440;
                  auVar131 = _DAT_008a1f40;
                  auVar148 = _DAT_008a1f40;
                  for (lVar17 = 0; auVar121 = auVar122, uVar20 << 4 != lVar17;
                      lVar17 = lVar17 + 0x10) {
                    auVar122 = *(undefined1 (*) [16])((long)*b_00 + lVar17);
                    auVar116 = *(undefined1 (*) [16])((long)*b_01 + lVar17);
                    auVar120 = *(undefined1 (*) [16])((long)*b_02 + lVar17);
                    auVar130 = *(undefined1 (*) [16])((long)*b_03 + lVar17);
                    auVar59 = paddsb(auVar112,*(undefined1 (*) [16])((long)pvVar4 + lVar17 + lVar27)
                                    );
                    cVar31 = auVar122[0];
                    bVar37 = auVar59[0];
                    bVar93 = ((char)bVar37 < cVar31) * cVar31 | ((char)bVar37 >= cVar31) * bVar37;
                    cVar31 = auVar122[1];
                    bVar42 = auVar59[1];
                    bVar95 = ((char)bVar42 < cVar31) * cVar31 | ((char)bVar42 >= cVar31) * bVar42;
                    cVar31 = auVar122[2];
                    bVar47 = auVar59[2];
                    bVar96 = ((char)bVar47 < cVar31) * cVar31 | ((char)bVar47 >= cVar31) * bVar47;
                    cVar31 = auVar122[3];
                    bVar51 = auVar59[3];
                    bVar97 = ((char)bVar51 < cVar31) * cVar31 | ((char)bVar51 >= cVar31) * bVar51;
                    cVar31 = auVar122[4];
                    bVar53 = auVar59[4];
                    bVar98 = ((char)bVar53 < cVar31) * cVar31 | ((char)bVar53 >= cVar31) * bVar53;
                    cVar31 = auVar122[5];
                    bVar54 = auVar59[5];
                    bVar99 = ((char)bVar54 < cVar31) * cVar31 | ((char)bVar54 >= cVar31) * bVar54;
                    cVar31 = auVar122[6];
                    bVar55 = auVar59[6];
                    bVar100 = ((char)bVar55 < cVar31) * cVar31 | ((char)bVar55 >= cVar31) * bVar55;
                    cVar31 = auVar122[7];
                    bVar56 = auVar59[7];
                    bVar101 = ((char)bVar56 < cVar31) * cVar31 | ((char)bVar56 >= cVar31) * bVar56;
                    cVar31 = auVar122[8];
                    bVar58 = auVar59[8];
                    bVar102 = ((char)bVar58 < cVar31) * cVar31 | ((char)bVar58 >= cVar31) * bVar58;
                    cVar31 = auVar122[9];
                    bVar66 = auVar59[9];
                    bVar103 = ((char)bVar66 < cVar31) * cVar31 | ((char)bVar66 >= cVar31) * bVar66;
                    cVar31 = auVar122[10];
                    bVar69 = auVar59[10];
                    bVar104 = ((char)bVar69 < cVar31) * cVar31 | ((char)bVar69 >= cVar31) * bVar69;
                    cVar31 = auVar122[0xb];
                    bVar73 = auVar59[0xb];
                    bVar105 = ((char)bVar73 < cVar31) * cVar31 | ((char)bVar73 >= cVar31) * bVar73;
                    cVar31 = auVar122[0xc];
                    bVar76 = auVar59[0xc];
                    bVar106 = ((char)bVar76 < cVar31) * cVar31 | ((char)bVar76 >= cVar31) * bVar76;
                    cVar31 = auVar122[0xd];
                    bVar78 = auVar59[0xd];
                    bVar107 = ((char)bVar78 < cVar31) * cVar31 | ((char)bVar78 >= cVar31) * bVar78;
                    cVar31 = auVar122[0xe];
                    bVar82 = auVar59[0xe];
                    bVar85 = auVar59[0xf];
                    bVar108 = ((char)bVar82 < cVar31) * cVar31 | ((char)bVar82 >= cVar31) * bVar82;
                    cVar31 = auVar122[0xf];
                    bVar109 = ((char)bVar85 < cVar31) * cVar31 | ((char)bVar85 >= cVar31) * bVar85;
                    cVar31 = auVar131[0];
                    auVar88[0] = ((char)bVar93 < cVar31) * cVar31 |
                                 ((char)bVar93 >= cVar31) * bVar93;
                    cVar30 = auVar131[1];
                    auVar88[1] = ((char)bVar95 < cVar30) * cVar30 |
                                 ((char)bVar95 >= cVar30) * bVar95;
                    cVar36 = auVar131[2];
                    auVar88[2] = ((char)bVar96 < cVar36) * cVar36 |
                                 ((char)bVar96 >= cVar36) * bVar96;
                    cVar39 = auVar131[3];
                    auVar88[3] = ((char)bVar97 < cVar39) * cVar39 |
                                 ((char)bVar97 >= cVar39) * bVar97;
                    cVar41 = auVar131[4];
                    auVar88[4] = ((char)bVar98 < cVar41) * cVar41 |
                                 ((char)bVar98 >= cVar41) * bVar98;
                    cVar44 = auVar131[5];
                    auVar88[5] = ((char)bVar99 < cVar44) * cVar44 |
                                 ((char)bVar99 >= cVar44) * bVar99;
                    cVar46 = auVar131[6];
                    auVar88[6] = ((char)bVar100 < cVar46) * cVar46 |
                                 ((char)bVar100 >= cVar46) * bVar100;
                    cVar49 = auVar131[7];
                    auVar88[7] = ((char)bVar101 < cVar49) * cVar49 |
                                 ((char)bVar101 >= cVar49) * bVar101;
                    cVar32 = auVar131[8];
                    auVar88[8] = ((char)bVar102 < cVar32) * cVar32 |
                                 ((char)bVar102 >= cVar32) * bVar102;
                    cVar38 = auVar131[9];
                    auVar88[9] = ((char)bVar103 < cVar38) * cVar38 |
                                 ((char)bVar103 >= cVar38) * bVar103;
                    cVar40 = auVar131[10];
                    auVar88[10] = ((char)bVar104 < cVar40) * cVar40 |
                                  ((char)bVar104 >= cVar40) * bVar104;
                    cVar43 = auVar131[0xb];
                    auVar88[0xb] = ((char)bVar105 < cVar43) * cVar43 |
                                   ((char)bVar105 >= cVar43) * bVar105;
                    cVar45 = auVar131[0xc];
                    auVar88[0xc] = ((char)bVar106 < cVar45) * cVar45 |
                                   ((char)bVar106 >= cVar45) * bVar106;
                    cVar48 = auVar131[0xd];
                    auVar88[0xd] = ((char)bVar107 < cVar48) * cVar48 |
                                   ((char)bVar107 >= cVar48) * bVar107;
                    cVar50 = auVar131[0xe];
                    auVar88[0xe] = ((char)bVar108 < cVar50) * cVar50 |
                                   ((char)bVar108 >= cVar50) * bVar108;
                    cVar52 = auVar131[0xf];
                    auVar88[0xf] = ((char)bVar109 < cVar52) * cVar52 |
                                   ((char)bVar109 >= cVar52) * bVar109;
                    *(undefined1 (*) [16])((long)*local_1d0 + lVar17) = auVar88;
                    auVar59 = _DAT_008a1f40;
                    auVar94[0] = -(cVar31 < (char)bVar93);
                    auVar94[1] = -(cVar30 < (char)bVar95);
                    auVar94[2] = -(cVar36 < (char)bVar96);
                    auVar94[3] = -(cVar39 < (char)bVar97);
                    auVar94[4] = -(cVar41 < (char)bVar98);
                    auVar94[5] = -(cVar44 < (char)bVar99);
                    auVar94[6] = -(cVar46 < (char)bVar100);
                    auVar94[7] = -(cVar49 < (char)bVar101);
                    auVar94[8] = -(cVar32 < (char)bVar102);
                    auVar94[9] = -(cVar38 < (char)bVar103);
                    auVar94[10] = -(cVar40 < (char)bVar104);
                    auVar94[0xb] = -(cVar43 < (char)bVar105);
                    auVar94[0xc] = -(cVar45 < (char)bVar106);
                    auVar94[0xd] = -(cVar48 < (char)bVar107);
                    auVar94[0xe] = -(cVar50 < (char)bVar108);
                    auVar94[0xf] = -(cVar52 < (char)bVar109);
                    auVar124 = pblendvb(auVar148,auVar116,auVar94);
                    auVar112 = paddsb(auVar114,*(undefined1 (*) [16])
                                                ((long)pvVar5 + lVar17 + lVar27));
                    auVar60[0] = -(bVar37 == auVar88[0]);
                    auVar60[1] = -(bVar42 == auVar88[1]);
                    auVar60[2] = -(bVar47 == auVar88[2]);
                    auVar60[3] = -(bVar51 == auVar88[3]);
                    auVar60[4] = -(bVar53 == auVar88[4]);
                    auVar60[5] = -(bVar54 == auVar88[5]);
                    auVar60[6] = -(bVar55 == auVar88[6]);
                    auVar60[7] = -(bVar56 == auVar88[7]);
                    auVar60[8] = -(bVar58 == auVar88[8]);
                    auVar60[9] = -(bVar66 == auVar88[9]);
                    auVar60[10] = -(bVar69 == auVar88[10]);
                    auVar60[0xb] = -(bVar73 == auVar88[0xb]);
                    auVar60[0xc] = -(bVar76 == auVar88[0xc]);
                    auVar60[0xd] = -(bVar78 == auVar88[0xd]);
                    auVar60[0xe] = -(bVar82 == auVar88[0xe]);
                    auVar60[0xf] = -(bVar85 == auVar88[0xf]);
                    auVar112 = pblendvb(auVar124,auVar112,auVar60);
                    auVar92[0] = -(auVar88[0] == DAT_008a1f40);
                    auVar92[1] = -(auVar88[1] == DAT_008a1f40._1_1_);
                    auVar92[2] = -(auVar88[2] == DAT_008a1f40._2_1_);
                    auVar92[3] = -(auVar88[3] == DAT_008a1f40._3_1_);
                    auVar92[4] = -(auVar88[4] == DAT_008a1f40._4_1_);
                    auVar92[5] = -(auVar88[5] == DAT_008a1f40._5_1_);
                    auVar92[6] = -(auVar88[6] == DAT_008a1f40._6_1_);
                    auVar92[7] = -(auVar88[7] == DAT_008a1f40._7_1_);
                    auVar92[8] = -(auVar88[8] == DAT_008a1f40._8_1_);
                    auVar92[9] = -(auVar88[9] == DAT_008a1f40._9_1_);
                    auVar92[10] = -(auVar88[10] == DAT_008a1f40._10_1_);
                    auVar92[0xb] = -(auVar88[0xb] == DAT_008a1f40._11_1_);
                    auVar92[0xc] = -(auVar88[0xc] == DAT_008a1f40._12_1_);
                    auVar92[0xd] = -(auVar88[0xd] == DAT_008a1f40._13_1_);
                    auVar92[0xe] = -(auVar88[0xe] == DAT_008a1f40._14_1_);
                    auVar92[0xf] = -(auVar88[0xf] == DAT_008a1f40._15_1_);
                    auVar125 = pblendvb(auVar112,_DAT_008a1f40,auVar92);
                    *(undefined1 (*) [16])((long)*b + lVar17) = auVar125;
                    auVar112 = pblendvb(auVar121,auVar120,auVar94);
                    auVar114 = paddsb(auVar115,*(undefined1 (*) [16])
                                                ((long)pvVar6 + lVar17 + lVar27));
                    auVar112 = pblendvb(auVar112,auVar114,auVar60);
                    auVar114 = pblendvb(auVar112,auVar59,auVar92);
                    auVar115 = pblendvb(auVar127,auVar130,auVar94);
                    auVar112 = paddsb(auVar110,_DAT_008a1d00);
                    auVar112 = pblendvb(auVar115,auVar112,auVar60);
                    auVar115 = pblendvb(auVar112,auVar59,auVar92);
                    *(undefined1 (*) [16])((long)*local_198 + lVar17) = auVar114;
                    *(undefined1 (*) [16])((long)*palVar13 + lVar17) = auVar115;
                    auVar59 = _DAT_008a1d00;
                    cVar31 = auVar115[0];
                    cVar30 = auVar114[0];
                    bVar58 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[1];
                    cVar30 = auVar114[1];
                    bVar102 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[2];
                    cVar30 = auVar114[2];
                    bVar66 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[3];
                    cVar30 = auVar114[3];
                    bVar103 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[4];
                    cVar30 = auVar114[4];
                    bVar69 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[5];
                    cVar30 = auVar114[5];
                    bVar104 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[6];
                    cVar30 = auVar114[6];
                    bVar105 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[7];
                    cVar30 = auVar114[7];
                    bVar73 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[8];
                    cVar30 = auVar114[8];
                    bVar106 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[9];
                    cVar30 = auVar114[9];
                    bVar76 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[10];
                    cVar30 = auVar114[10];
                    bVar78 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[0xb];
                    cVar30 = auVar114[0xb];
                    bVar107 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[0xc];
                    cVar30 = auVar114[0xc];
                    bVar108 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[0xd];
                    cVar30 = auVar114[0xd];
                    bVar82 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[0xe];
                    cVar30 = auVar114[0xe];
                    cVar36 = auVar114[0xf];
                    bVar109 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                    cVar31 = auVar115[0xf];
                    bVar85 = (cVar36 < cVar31) * cVar31 | (cVar36 >= cVar31) * cVar36;
                    local_d8[1] = ((char)local_d8[1] < (char)auVar88[1]) * auVar88[1] |
                                  ((char)local_d8[1] >= (char)auVar88[1]) * local_d8[1];
                    local_d8[0] = ((char)local_d8[0] < (char)auVar88[0]) * auVar88[0] |
                                  ((char)local_d8[0] >= (char)auVar88[0]) * local_d8[0];
                    local_d8[2] = ((char)local_d8[2] < (char)auVar88[2]) * auVar88[2] |
                                  ((char)local_d8[2] >= (char)auVar88[2]) * local_d8[2];
                    local_d8[3] = ((char)local_d8[3] < (char)auVar88[3]) * auVar88[3] |
                                  ((char)local_d8[3] >= (char)auVar88[3]) * local_d8[3];
                    local_d8[4] = ((char)local_d8[4] < (char)auVar88[4]) * auVar88[4] |
                                  ((char)local_d8[4] >= (char)auVar88[4]) * local_d8[4];
                    local_d8[5] = ((char)local_d8[5] < (char)auVar88[5]) * auVar88[5] |
                                  ((char)local_d8[5] >= (char)auVar88[5]) * local_d8[5];
                    local_d8[6] = ((char)local_d8[6] < (char)auVar88[6]) * auVar88[6] |
                                  ((char)local_d8[6] >= (char)auVar88[6]) * local_d8[6];
                    local_d8[7] = ((char)local_d8[7] < (char)auVar88[7]) * auVar88[7] |
                                  ((char)local_d8[7] >= (char)auVar88[7]) * local_d8[7];
                    local_d8[8] = ((char)local_d8[8] < (char)auVar88[8]) * auVar88[8] |
                                  ((char)local_d8[8] >= (char)auVar88[8]) * local_d8[8];
                    local_d8[9] = ((char)local_d8[9] < (char)auVar88[9]) * auVar88[9] |
                                  ((char)local_d8[9] >= (char)auVar88[9]) * local_d8[9];
                    local_d8[10] = ((char)local_d8[10] < (char)auVar88[10]) * auVar88[10] |
                                   ((char)local_d8[10] >= (char)auVar88[10]) * local_d8[10];
                    local_d8[0xb] =
                         ((char)local_d8[0xb] < (char)auVar88[0xb]) * auVar88[0xb] |
                         ((char)local_d8[0xb] >= (char)auVar88[0xb]) * local_d8[0xb];
                    local_d8[0xc] =
                         ((char)local_d8[0xc] < (char)auVar88[0xc]) * auVar88[0xc] |
                         ((char)local_d8[0xc] >= (char)auVar88[0xc]) * local_d8[0xc];
                    local_d8[0xd] =
                         ((char)local_d8[0xd] < (char)auVar88[0xd]) * auVar88[0xd] |
                         ((char)local_d8[0xd] >= (char)auVar88[0xd]) * local_d8[0xd];
                    local_d8[0xe] =
                         ((char)local_d8[0xe] < (char)auVar88[0xe]) * auVar88[0xe] |
                         ((char)local_d8[0xe] >= (char)auVar88[0xe]) * local_d8[0xe];
                    local_d8[0xf] =
                         ((char)local_d8[0xf] < (char)auVar88[0xf]) * auVar88[0xf] |
                         ((char)local_d8[0xf] >= (char)auVar88[0xf]) * local_d8[0xf];
                    auVar112 = psubsb(auVar88,auVar87);
                    auVar122 = psubsb(auVar122,auVar91);
                    cVar30 = auVar112[0];
                    cVar65 = auVar122[0];
                    auVar124[0] = -(cVar65 < cVar30);
                    cVar36 = auVar112[1];
                    cVar67 = auVar122[1];
                    auVar124[1] = -(cVar67 < cVar36);
                    cVar39 = auVar112[2];
                    cVar68 = auVar122[2];
                    auVar124[2] = -(cVar68 < cVar39);
                    cVar41 = auVar112[3];
                    cVar70 = auVar122[3];
                    auVar124[3] = -(cVar70 < cVar41);
                    cVar44 = auVar112[4];
                    cVar71 = auVar122[4];
                    auVar124[4] = -(cVar71 < cVar44);
                    cVar46 = auVar112[5];
                    cVar72 = auVar122[5];
                    auVar124[5] = -(cVar72 < cVar46);
                    cVar49 = auVar112[6];
                    cVar74 = auVar122[6];
                    auVar124[6] = -(cVar74 < cVar49);
                    cVar32 = auVar112[7];
                    cVar75 = auVar122[7];
                    auVar124[7] = -(cVar75 < cVar32);
                    cVar38 = auVar112[8];
                    cVar77 = auVar122[8];
                    auVar124[8] = -(cVar77 < cVar38);
                    cVar40 = auVar112[9];
                    cVar79 = auVar122[9];
                    auVar124[9] = -(cVar79 < cVar40);
                    cVar43 = auVar112[10];
                    cVar80 = auVar122[10];
                    auVar124[10] = -(cVar80 < cVar43);
                    cVar45 = auVar112[0xb];
                    cVar81 = auVar122[0xb];
                    auVar124[0xb] = -(cVar81 < cVar45);
                    cVar48 = auVar112[0xc];
                    cVar83 = auVar122[0xc];
                    auVar124[0xc] = -(cVar83 < cVar48);
                    cVar50 = auVar112[0xd];
                    cVar84 = auVar122[0xd];
                    auVar124[0xd] = -(cVar84 < cVar50);
                    cVar52 = auVar112[0xe];
                    cVar86 = auVar122[0xe];
                    cVar57 = auVar112[0xf];
                    auVar124[0xe] = -(cVar86 < cVar52);
                    cVar123 = auVar122[0xf];
                    auVar124[0xf] = -(cVar123 < cVar57);
                    auVar112 = pblendvb(auVar116,auVar125,auVar124);
                    auVar122 = pblendvb(auVar120,auVar114,auVar124);
                    auVar120 = paddsb(auVar130,_DAT_008a1d00);
                    auVar116 = paddsb(auVar115,_DAT_008a1d00);
                    auVar120 = pblendvb(auVar120,auVar116,auVar124);
                    auVar130 = psubsb(auVar131,auVar91);
                    cVar128 = auVar130[0];
                    auVar89[0] = -(cVar128 < cVar30);
                    cVar132 = auVar130[1];
                    auVar89[1] = -(cVar132 < cVar36);
                    cVar133 = auVar130[2];
                    auVar89[2] = -(cVar133 < cVar39);
                    cVar134 = auVar130[3];
                    auVar89[3] = -(cVar134 < cVar41);
                    cVar135 = auVar130[4];
                    auVar89[4] = -(cVar135 < cVar44);
                    cVar136 = auVar130[5];
                    auVar89[5] = -(cVar136 < cVar46);
                    cVar137 = auVar130[6];
                    auVar89[6] = -(cVar137 < cVar49);
                    cVar138 = auVar130[7];
                    auVar89[7] = -(cVar138 < cVar32);
                    cVar139 = auVar130[8];
                    auVar89[8] = -(cVar139 < cVar38);
                    cVar140 = auVar130[9];
                    auVar89[9] = -(cVar140 < cVar40);
                    cVar141 = auVar130[10];
                    auVar89[10] = -(cVar141 < cVar43);
                    cVar142 = auVar130[0xb];
                    auVar89[0xb] = -(cVar142 < cVar45);
                    cVar143 = auVar130[0xc];
                    auVar89[0xc] = -(cVar143 < cVar48);
                    cVar144 = auVar130[0xd];
                    auVar89[0xd] = -(cVar144 < cVar50);
                    cVar145 = auVar130[0xe];
                    auVar89[0xe] = -(cVar145 < cVar52);
                    cVar146 = auVar130[0xf];
                    auVar89[0xf] = -(cVar146 < cVar57);
                    auVar148 = pblendvb(auVar148,auVar125,auVar89);
                    cVar31 = auVar125[0];
                    bVar93 = ((char)local_158[0] < cVar31) * cVar31 |
                             ((char)local_158[0] >= cVar31) * local_158[0];
                    cVar31 = auVar125[1];
                    bVar37 = ((char)local_158[1] < cVar31) * cVar31 |
                             ((char)local_158[1] >= cVar31) * local_158[1];
                    cVar31 = auVar125[2];
                    bVar95 = ((char)local_158[2] < cVar31) * cVar31 |
                             ((char)local_158[2] >= cVar31) * local_158[2];
                    cVar31 = auVar125[3];
                    bVar42 = ((char)local_158[3] < cVar31) * cVar31 |
                             ((char)local_158[3] >= cVar31) * local_158[3];
                    cVar31 = auVar125[4];
                    bVar96 = ((char)local_158[4] < cVar31) * cVar31 |
                             ((char)local_158[4] >= cVar31) * local_158[4];
                    cVar31 = auVar125[5];
                    bVar47 = ((char)local_158[5] < cVar31) * cVar31 |
                             ((char)local_158[5] >= cVar31) * local_158[5];
                    cVar31 = auVar125[6];
                    bVar97 = ((char)local_158[6] < cVar31) * cVar31 |
                             ((char)local_158[6] >= cVar31) * local_158[6];
                    cVar31 = auVar125[7];
                    bVar51 = ((char)local_158[7] < cVar31) * cVar31 |
                             ((char)local_158[7] >= cVar31) * local_158[7];
                    cVar31 = auVar125[8];
                    bVar53 = ((char)local_158[8] < cVar31) * cVar31 |
                             ((char)local_158[8] >= cVar31) * local_158[8];
                    cVar31 = auVar125[9];
                    bVar98 = ((char)local_158[9] < cVar31) * cVar31 |
                             ((char)local_158[9] >= cVar31) * local_158[9];
                    cVar31 = auVar125[10];
                    bVar54 = ((char)local_158[10] < cVar31) * cVar31 |
                             ((char)local_158[10] >= cVar31) * local_158[10];
                    cVar31 = auVar125[0xb];
                    bVar99 = ((char)local_158[0xb] < cVar31) * cVar31 |
                             ((char)local_158[0xb] >= cVar31) * local_158[0xb];
                    cVar31 = auVar125[0xc];
                    bVar55 = ((char)local_158[0xc] < cVar31) * cVar31 |
                             ((char)local_158[0xc] >= cVar31) * local_158[0xc];
                    cVar31 = auVar125[0xd];
                    bVar100 = ((char)local_158[0xd] < cVar31) * cVar31 |
                              ((char)local_158[0xd] >= cVar31) * local_158[0xd];
                    cVar31 = auVar125[0xe];
                    bVar56 = ((char)local_158[0xe] < cVar31) * cVar31 |
                             ((char)local_158[0xe] >= cVar31) * local_158[0xe];
                    cVar31 = auVar125[0xf];
                    bVar101 = ((char)local_158[0xf] < cVar31) * cVar31 |
                              ((char)local_158[0xf] >= cVar31) * local_158[0xf];
                    local_158[1] = ((char)bVar37 < (char)bVar102) * bVar102 |
                                   ((char)bVar37 >= (char)bVar102) * bVar37;
                    local_158[0] = ((char)bVar93 < (char)bVar58) * bVar58 |
                                   ((char)bVar93 >= (char)bVar58) * bVar93;
                    local_158[2] = ((char)bVar95 < (char)bVar66) * bVar66 |
                                   ((char)bVar95 >= (char)bVar66) * bVar95;
                    local_158[3] = ((char)bVar42 < (char)bVar103) * bVar103 |
                                   ((char)bVar42 >= (char)bVar103) * bVar42;
                    local_158[4] = ((char)bVar96 < (char)bVar69) * bVar69 |
                                   ((char)bVar96 >= (char)bVar69) * bVar96;
                    local_158[5] = ((char)bVar47 < (char)bVar104) * bVar104 |
                                   ((char)bVar47 >= (char)bVar104) * bVar47;
                    local_158[6] = ((char)bVar97 < (char)bVar105) * bVar105 |
                                   ((char)bVar97 >= (char)bVar105) * bVar97;
                    local_158[7] = ((char)bVar51 < (char)bVar73) * bVar73 |
                                   ((char)bVar51 >= (char)bVar73) * bVar51;
                    local_158[8] = ((char)bVar53 < (char)bVar106) * bVar106 |
                                   ((char)bVar53 >= (char)bVar106) * bVar53;
                    local_158[9] = ((char)bVar98 < (char)bVar76) * bVar76 |
                                   ((char)bVar98 >= (char)bVar76) * bVar98;
                    local_158[10] =
                         ((char)bVar54 < (char)bVar78) * bVar78 |
                         ((char)bVar54 >= (char)bVar78) * bVar54;
                    local_158[0xb] =
                         ((char)bVar99 < (char)bVar107) * bVar107 |
                         ((char)bVar99 >= (char)bVar107) * bVar99;
                    local_158[0xc] =
                         ((char)bVar55 < (char)bVar108) * bVar108 |
                         ((char)bVar55 >= (char)bVar108) * bVar55;
                    local_158[0xd] =
                         ((char)bVar100 < (char)bVar82) * bVar82 |
                         ((char)bVar100 >= (char)bVar82) * bVar100;
                    local_158[0xe] =
                         ((char)bVar56 < (char)bVar109) * bVar109 |
                         ((char)bVar56 >= (char)bVar109) * bVar56;
                    local_158[0xf] =
                         ((char)bVar101 < (char)bVar85) * bVar85 |
                         ((char)bVar101 >= (char)bVar85) * bVar101;
                    pbVar1 = (byte *)((long)*b_00 + lVar17);
                    *pbVar1 = (cVar30 < cVar65) * cVar65 | (cVar30 >= cVar65) * cVar30;
                    pbVar1[1] = (cVar36 < cVar67) * cVar67 | (cVar36 >= cVar67) * cVar36;
                    pbVar1[2] = (cVar39 < cVar68) * cVar68 | (cVar39 >= cVar68) * cVar39;
                    pbVar1[3] = (cVar41 < cVar70) * cVar70 | (cVar41 >= cVar70) * cVar41;
                    pbVar1[4] = (cVar44 < cVar71) * cVar71 | (cVar44 >= cVar71) * cVar44;
                    pbVar1[5] = (cVar46 < cVar72) * cVar72 | (cVar46 >= cVar72) * cVar46;
                    pbVar1[6] = (cVar49 < cVar74) * cVar74 | (cVar49 >= cVar74) * cVar49;
                    pbVar1[7] = (cVar32 < cVar75) * cVar75 | (cVar32 >= cVar75) * cVar32;
                    pbVar1[8] = (cVar38 < cVar77) * cVar77 | (cVar38 >= cVar77) * cVar38;
                    pbVar1[9] = (cVar40 < cVar79) * cVar79 | (cVar40 >= cVar79) * cVar40;
                    pbVar1[10] = (cVar43 < cVar80) * cVar80 | (cVar43 >= cVar80) * cVar43;
                    pbVar1[0xb] = (cVar45 < cVar81) * cVar81 | (cVar45 >= cVar81) * cVar45;
                    pbVar1[0xc] = (cVar48 < cVar83) * cVar83 | (cVar48 >= cVar83) * cVar48;
                    pbVar1[0xd] = (cVar50 < cVar84) * cVar84 | (cVar50 >= cVar84) * cVar50;
                    pbVar1[0xe] = (cVar52 < cVar86) * cVar86 | (cVar52 >= cVar86) * cVar52;
                    pbVar1[0xf] = (cVar57 < cVar123) * cVar123 | (cVar57 >= cVar123) * cVar57;
                    *(undefined1 (*) [16])((long)*b_01 + lVar17) = auVar112;
                    *(undefined1 (*) [16])((long)*b_02 + lVar17) = auVar122;
                    *(undefined1 (*) [16])((long)*b_03 + lVar17) = auVar120;
                    auVar131[0] = (cVar30 < cVar128) * cVar128 | (cVar30 >= cVar128) * cVar30;
                    auVar131[1] = (cVar36 < cVar132) * cVar132 | (cVar36 >= cVar132) * cVar36;
                    auVar131[2] = (cVar39 < cVar133) * cVar133 | (cVar39 >= cVar133) * cVar39;
                    auVar131[3] = (cVar41 < cVar134) * cVar134 | (cVar41 >= cVar134) * cVar41;
                    auVar131[4] = (cVar44 < cVar135) * cVar135 | (cVar44 >= cVar135) * cVar44;
                    auVar131[5] = (cVar46 < cVar136) * cVar136 | (cVar46 >= cVar136) * cVar46;
                    auVar131[6] = (cVar49 < cVar137) * cVar137 | (cVar49 >= cVar137) * cVar49;
                    auVar131[7] = (cVar32 < cVar138) * cVar138 | (cVar32 >= cVar138) * cVar32;
                    auVar131[8] = (cVar38 < cVar139) * cVar139 | (cVar38 >= cVar139) * cVar38;
                    auVar131[9] = (cVar40 < cVar140) * cVar140 | (cVar40 >= cVar140) * cVar40;
                    auVar131[10] = (cVar43 < cVar141) * cVar141 | (cVar43 >= cVar141) * cVar43;
                    auVar131[0xb] = (cVar45 < cVar142) * cVar142 | (cVar45 >= cVar142) * cVar45;
                    auVar131[0xc] = (cVar48 < cVar143) * cVar143 | (cVar48 >= cVar143) * cVar48;
                    auVar131[0xd] = (cVar50 < cVar144) * cVar144 | (cVar50 >= cVar144) * cVar50;
                    auVar131[0xe] = (cVar52 < cVar145) * cVar145 | (cVar52 >= cVar145) * cVar52;
                    auVar131[0xf] = (cVar57 < cVar146) * cVar146 | (cVar57 >= cVar146) * cVar57;
                    auVar122 = pblendvb(auVar121,auVar114,auVar89);
                    auVar120 = paddsb(auVar127,auVar59);
                    auVar127 = pblendvb(auVar120,auVar116,auVar89);
                    auVar112 = *(undefined1 (*) [16])((long)*palVar21 + lVar17);
                    auVar114 = *(undefined1 (*) [16])((long)*palVar19 + lVar17);
                    auVar115 = *(undefined1 (*) [16])((long)*palVar25 + lVar17);
                    auVar110 = *(undefined1 (*) [16])((long)*palVar14 + lVar17);
                    local_188 = auVar121;
                  }
                  if ((int)local_168 == iVar10) {
                    local_1a0 = local_1b8;
                    local_1a8 = local_1c0;
                    local_1b0 = local_1c8;
                  }
                  for (iVar10 = 0; iVar10 != 0x10; iVar10 = iVar10 + 1) {
                    uVar126 = palVar21[uVar16][0];
                    auVar125._8_8_ = palVar21[uVar16][1] << 8 | uVar126 >> 0x38;
                    uVar129 = auVar131._0_8_;
                    auVar131._8_8_ = auVar131._8_8_ << 8 | uVar129 >> 0x38;
                    uVar147 = auVar148._0_8_;
                    auVar148._8_8_ = auVar148._8_8_ << 8 | uVar147 >> 0x38;
                    uVar119 = auVar121._0_8_;
                    auVar121._8_8_ = auVar121._8_8_ << 8 | uVar119 >> 0x38;
                    auVar125._0_8_ = uVar126 << 8 | 0x80;
                    auVar131._0_8_ = uVar129 << 8 | 0x80;
                    auVar148._0_8_ = uVar147 << 8 | 0x80;
                    auVar121._0_8_ = uVar119 << 8 | 0x80;
                    uVar126 = auVar127._0_8_;
                    auVar127._8_8_ = auVar127._8_8_ << 8 | uVar126 >> 0x38;
                    auVar127._0_8_ = uVar126 << 8 | 0x81;
                    auVar122 = local_d8;
                    for (lVar17 = 0; uVar20 << 4 != lVar17; lVar17 = lVar17 + 0x10) {
                      auVar116 = paddsb(auVar125,*(undefined1 (*) [16])
                                                  ((long)pvVar4 + lVar17 + lVar27));
                      pcVar15 = (char *)((long)*local_1d0 + lVar17);
                      cVar57 = *pcVar15;
                      cVar65 = pcVar15[1];
                      cVar67 = pcVar15[2];
                      cVar68 = pcVar15[3];
                      cVar70 = pcVar15[4];
                      cVar71 = pcVar15[5];
                      cVar72 = pcVar15[6];
                      cVar74 = pcVar15[7];
                      cVar75 = pcVar15[8];
                      cVar77 = pcVar15[9];
                      cVar79 = pcVar15[10];
                      cVar80 = pcVar15[0xb];
                      cVar81 = pcVar15[0xc];
                      cVar83 = pcVar15[0xd];
                      cVar84 = pcVar15[0xe];
                      cVar86 = pcVar15[0xf];
                      cVar31 = auVar131[0];
                      auVar61[0] = (cVar57 < cVar31) * cVar31 | (cVar57 >= cVar31) * cVar57;
                      cVar30 = auVar131[1];
                      auVar61[1] = (cVar65 < cVar30) * cVar30 | (cVar65 >= cVar30) * cVar65;
                      cVar36 = auVar131[2];
                      auVar61[2] = (cVar67 < cVar36) * cVar36 | (cVar67 >= cVar36) * cVar67;
                      cVar39 = auVar131[3];
                      auVar61[3] = (cVar68 < cVar39) * cVar39 | (cVar68 >= cVar39) * cVar68;
                      cVar41 = auVar131[4];
                      auVar61[4] = (cVar70 < cVar41) * cVar41 | (cVar70 >= cVar41) * cVar70;
                      cVar44 = auVar131[5];
                      auVar61[5] = (cVar71 < cVar44) * cVar44 | (cVar71 >= cVar44) * cVar71;
                      cVar46 = auVar131[6];
                      auVar61[6] = (cVar72 < cVar46) * cVar46 | (cVar72 >= cVar46) * cVar72;
                      cVar49 = auVar131[7];
                      auVar61[7] = (cVar74 < cVar49) * cVar49 | (cVar74 >= cVar49) * cVar74;
                      cVar32 = auVar131[8];
                      auVar61[8] = (cVar75 < cVar32) * cVar32 | (cVar75 >= cVar32) * cVar75;
                      cVar38 = auVar131[9];
                      auVar61[9] = (cVar77 < cVar38) * cVar38 | (cVar77 >= cVar38) * cVar77;
                      cVar40 = auVar131[10];
                      auVar61[10] = (cVar79 < cVar40) * cVar40 | (cVar79 >= cVar40) * cVar79;
                      cVar43 = auVar131[0xb];
                      auVar61[0xb] = (cVar80 < cVar43) * cVar43 | (cVar80 >= cVar43) * cVar80;
                      cVar45 = auVar131[0xc];
                      auVar61[0xc] = (cVar81 < cVar45) * cVar45 | (cVar81 >= cVar45) * cVar81;
                      cVar48 = auVar131[0xd];
                      auVar61[0xd] = (cVar83 < cVar48) * cVar48 | (cVar83 >= cVar48) * cVar83;
                      cVar50 = auVar131[0xe];
                      auVar61[0xe] = (cVar84 < cVar50) * cVar50 | (cVar84 >= cVar50) * cVar84;
                      cVar52 = auVar131[0xf];
                      auVar61[0xf] = (cVar86 < cVar52) * cVar52 | (cVar86 >= cVar52) * cVar86;
                      *(undefined1 (*) [16])((long)*local_1d0 + lVar17) = auVar61;
                      auVar90[0] = -(auVar116[0] == auVar61[0]);
                      auVar90[1] = -(auVar116[1] == auVar61[1]);
                      auVar90[2] = -(auVar116[2] == auVar61[2]);
                      auVar90[3] = -(auVar116[3] == auVar61[3]);
                      auVar90[4] = -(auVar116[4] == auVar61[4]);
                      auVar90[5] = -(auVar116[5] == auVar61[5]);
                      auVar90[6] = -(auVar116[6] == auVar61[6]);
                      auVar90[7] = -(auVar116[7] == auVar61[7]);
                      auVar90[8] = -(auVar116[8] == auVar61[8]);
                      auVar90[9] = -(auVar116[9] == auVar61[9]);
                      auVar90[10] = -(auVar116[10] == auVar61[10]);
                      auVar90[0xb] = -(auVar116[0xb] == auVar61[0xb]);
                      auVar90[0xc] = -(auVar116[0xc] == auVar61[0xc]);
                      auVar90[0xd] = -(auVar116[0xd] == auVar61[0xd]);
                      auVar90[0xe] = -(auVar116[0xe] == auVar61[0xe]);
                      auVar90[0xf] = -(auVar116[0xf] == auVar61[0xf]);
                      auVar34[0] = -(cVar31 < cVar57);
                      auVar34[1] = -(cVar30 < cVar65);
                      auVar34[2] = -(cVar36 < cVar67);
                      auVar34[3] = -(cVar39 < cVar68);
                      auVar34[4] = -(cVar41 < cVar70);
                      auVar34[5] = -(cVar44 < cVar71);
                      auVar34[6] = -(cVar46 < cVar72);
                      auVar34[7] = -(cVar49 < cVar74);
                      auVar34[8] = -(cVar32 < cVar75);
                      auVar34[9] = -(cVar38 < cVar77);
                      auVar34[10] = -(cVar40 < cVar79);
                      auVar34[0xb] = -(cVar43 < cVar80);
                      auVar34[0xc] = -(cVar45 < cVar81);
                      auVar34[0xd] = -(cVar48 < cVar83);
                      auVar34[0xe] = -(cVar50 < cVar84);
                      auVar34[0xf] = -(cVar52 < cVar86);
                      auVar34 = auVar34 | auVar90;
                      auVar116 = pblendvb(auVar148,*(undefined1 (*) [16])((long)*b + lVar17),auVar34
                                         );
                      *(undefined1 (*) [16])((long)*b + lVar17) = auVar116;
                      auVar130 = pblendvb(auVar121,*(undefined1 (*) [16])((long)*local_198 + lVar17)
                                          ,auVar34);
                      *(undefined1 (*) [16])((long)*local_198 + lVar17) = auVar130;
                      auVar120 = pblendvb(auVar127,*(undefined1 (*) [16])((long)*palVar13 + lVar17),
                                          auVar34);
                      *(undefined1 (*) [16])((long)*palVar13 + lVar17) = auVar120;
                      cVar31 = auVar116[0];
                      cVar30 = local_158[0];
                      bVar93 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[1];
                      cVar30 = local_158[1];
                      bVar37 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[2];
                      cVar30 = local_158[2];
                      bVar95 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[3];
                      cVar30 = local_158[3];
                      bVar42 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[4];
                      cVar30 = local_158[4];
                      bVar96 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[5];
                      cVar30 = local_158[5];
                      bVar47 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[6];
                      cVar30 = local_158[6];
                      bVar97 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[7];
                      cVar30 = local_158[7];
                      bVar51 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[8];
                      cVar30 = local_158[8];
                      bVar53 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[9];
                      cVar30 = local_158[9];
                      bVar98 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[10];
                      cVar30 = local_158[10];
                      bVar54 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[0xb];
                      cVar30 = local_158[0xb];
                      bVar99 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[0xc];
                      cVar30 = local_158[0xc];
                      bVar55 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[0xd];
                      cVar30 = local_158[0xd];
                      bVar100 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[0xe];
                      cVar30 = local_158[0xe];
                      cVar36 = local_158[0xf];
                      bVar56 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar116[0xf];
                      bVar101 = (cVar36 < cVar31) * cVar31 | (cVar36 >= cVar31) * cVar36;
                      cVar31 = auVar120[0];
                      cVar30 = auVar130[0];
                      bVar58 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[1];
                      cVar30 = auVar130[1];
                      bVar102 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[2];
                      cVar30 = auVar130[2];
                      bVar66 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[3];
                      cVar30 = auVar130[3];
                      bVar103 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[4];
                      cVar30 = auVar130[4];
                      bVar69 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[5];
                      cVar30 = auVar130[5];
                      bVar104 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[6];
                      cVar30 = auVar130[6];
                      bVar105 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[7];
                      cVar30 = auVar130[7];
                      bVar73 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[8];
                      cVar30 = auVar130[8];
                      bVar106 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[9];
                      cVar30 = auVar130[9];
                      bVar76 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[10];
                      cVar30 = auVar130[10];
                      bVar78 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[0xb];
                      cVar30 = auVar130[0xb];
                      bVar107 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[0xc];
                      cVar30 = auVar130[0xc];
                      bVar108 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[0xd];
                      cVar30 = auVar130[0xd];
                      bVar82 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[0xe];
                      cVar30 = auVar130[0xe];
                      cVar36 = auVar130[0xf];
                      bVar109 = (cVar30 < cVar31) * cVar31 | (cVar30 >= cVar31) * cVar30;
                      cVar31 = auVar120[0xf];
                      bVar85 = (cVar36 < cVar31) * cVar31 | (cVar36 >= cVar31) * cVar36;
                      local_158[0] = ((char)bVar58 < (char)bVar93) * bVar93 |
                                     ((char)bVar58 >= (char)bVar93) * bVar58;
                      local_158[1] = ((char)bVar102 < (char)bVar37) * bVar37 |
                                     ((char)bVar102 >= (char)bVar37) * bVar102;
                      local_158[2] = ((char)bVar66 < (char)bVar95) * bVar95 |
                                     ((char)bVar66 >= (char)bVar95) * bVar66;
                      local_158[3] = ((char)bVar103 < (char)bVar42) * bVar42 |
                                     ((char)bVar103 >= (char)bVar42) * bVar103;
                      local_158[4] = ((char)bVar69 < (char)bVar96) * bVar96 |
                                     ((char)bVar69 >= (char)bVar96) * bVar69;
                      local_158[5] = ((char)bVar104 < (char)bVar47) * bVar47 |
                                     ((char)bVar104 >= (char)bVar47) * bVar104;
                      local_158[6] = ((char)bVar105 < (char)bVar97) * bVar97 |
                                     ((char)bVar105 >= (char)bVar97) * bVar105;
                      local_158[7] = ((char)bVar73 < (char)bVar51) * bVar51 |
                                     ((char)bVar73 >= (char)bVar51) * bVar73;
                      local_158[8] = ((char)bVar106 < (char)bVar53) * bVar53 |
                                     ((char)bVar106 >= (char)bVar53) * bVar106;
                      local_158[9] = ((char)bVar76 < (char)bVar98) * bVar98 |
                                     ((char)bVar76 >= (char)bVar98) * bVar76;
                      local_158[10] =
                           ((char)bVar78 < (char)bVar54) * bVar54 |
                           ((char)bVar78 >= (char)bVar54) * bVar78;
                      local_158[0xb] =
                           ((char)bVar107 < (char)bVar99) * bVar99 |
                           ((char)bVar107 >= (char)bVar99) * bVar107;
                      local_158[0xc] =
                           ((char)bVar108 < (char)bVar55) * bVar55 |
                           ((char)bVar108 >= (char)bVar55) * bVar108;
                      local_158[0xd] =
                           ((char)bVar82 < (char)bVar100) * bVar100 |
                           ((char)bVar82 >= (char)bVar100) * bVar82;
                      local_158[0xe] =
                           ((char)bVar109 < (char)bVar56) * bVar56 |
                           ((char)bVar109 >= (char)bVar56) * bVar109;
                      local_158[0xf] =
                           ((char)bVar85 < (char)bVar101) * bVar101 |
                           ((char)bVar85 >= (char)bVar101) * bVar85;
                      cVar31 = auVar122[0];
                      local_d8[0] = (cVar31 < (char)auVar61[0]) * auVar61[0] |
                                    (cVar31 >= (char)auVar61[0]) * cVar31;
                      cVar31 = auVar122[1];
                      local_d8[1] = (cVar31 < (char)auVar61[1]) * auVar61[1] |
                                    (cVar31 >= (char)auVar61[1]) * cVar31;
                      cVar31 = auVar122[2];
                      local_d8[2] = (cVar31 < (char)auVar61[2]) * auVar61[2] |
                                    (cVar31 >= (char)auVar61[2]) * cVar31;
                      cVar31 = auVar122[3];
                      local_d8[3] = (cVar31 < (char)auVar61[3]) * auVar61[3] |
                                    (cVar31 >= (char)auVar61[3]) * cVar31;
                      cVar31 = auVar122[4];
                      local_d8[4] = (cVar31 < (char)auVar61[4]) * auVar61[4] |
                                    (cVar31 >= (char)auVar61[4]) * cVar31;
                      cVar31 = auVar122[5];
                      local_d8[5] = (cVar31 < (char)auVar61[5]) * auVar61[5] |
                                    (cVar31 >= (char)auVar61[5]) * cVar31;
                      cVar31 = auVar122[6];
                      local_d8[6] = (cVar31 < (char)auVar61[6]) * auVar61[6] |
                                    (cVar31 >= (char)auVar61[6]) * cVar31;
                      cVar31 = auVar122[7];
                      local_d8[7] = (cVar31 < (char)auVar61[7]) * auVar61[7] |
                                    (cVar31 >= (char)auVar61[7]) * cVar31;
                      cVar31 = auVar122[8];
                      local_d8[8] = (cVar31 < (char)auVar61[8]) * auVar61[8] |
                                    (cVar31 >= (char)auVar61[8]) * cVar31;
                      cVar31 = auVar122[9];
                      local_d8[9] = (cVar31 < (char)auVar61[9]) * auVar61[9] |
                                    (cVar31 >= (char)auVar61[9]) * cVar31;
                      cVar31 = auVar122[10];
                      local_d8[10] = (cVar31 < (char)auVar61[10]) * auVar61[10] |
                                     (cVar31 >= (char)auVar61[10]) * cVar31;
                      cVar31 = auVar122[0xb];
                      local_d8[0xb] =
                           (cVar31 < (char)auVar61[0xb]) * auVar61[0xb] |
                           (cVar31 >= (char)auVar61[0xb]) * cVar31;
                      cVar31 = auVar122[0xc];
                      local_d8[0xc] =
                           (cVar31 < (char)auVar61[0xc]) * auVar61[0xc] |
                           (cVar31 >= (char)auVar61[0xc]) * cVar31;
                      cVar31 = auVar122[0xd];
                      local_d8[0xd] =
                           (cVar31 < (char)auVar61[0xd]) * auVar61[0xd] |
                           (cVar31 >= (char)auVar61[0xd]) * cVar31;
                      cVar31 = auVar122[0xe];
                      cVar30 = auVar122[0xf];
                      local_d8[0xe] =
                           (cVar31 < (char)auVar61[0xe]) * auVar61[0xe] |
                           (cVar31 >= (char)auVar61[0xe]) * cVar31;
                      local_d8[0xf] =
                           (cVar30 < (char)auVar61[0xf]) * auVar61[0xf] |
                           (cVar30 >= (char)auVar61[0xf]) * cVar30;
                      auVar122 = psubsb(auVar61,auVar87);
                      auVar131 = psubsb(auVar131,auVar91);
                      cVar31 = auVar131[0];
                      cVar57 = auVar122[0];
                      auVar118[0] = -(cVar57 < cVar31);
                      cVar30 = auVar131[1];
                      cVar65 = auVar122[1];
                      auVar118[1] = -(cVar65 < cVar30);
                      cVar36 = auVar131[2];
                      cVar67 = auVar122[2];
                      auVar118[2] = -(cVar67 < cVar36);
                      cVar39 = auVar131[3];
                      cVar68 = auVar122[3];
                      auVar118[3] = -(cVar68 < cVar39);
                      cVar41 = auVar131[4];
                      cVar70 = auVar122[4];
                      auVar118[4] = -(cVar70 < cVar41);
                      cVar44 = auVar131[5];
                      cVar71 = auVar122[5];
                      auVar118[5] = -(cVar71 < cVar44);
                      cVar46 = auVar131[6];
                      cVar72 = auVar122[6];
                      auVar118[6] = -(cVar72 < cVar46);
                      cVar49 = auVar131[7];
                      cVar74 = auVar122[7];
                      auVar118[7] = -(cVar74 < cVar49);
                      cVar32 = auVar131[8];
                      cVar75 = auVar122[8];
                      auVar118[8] = -(cVar75 < cVar32);
                      cVar38 = auVar131[9];
                      cVar77 = auVar122[9];
                      auVar118[9] = -(cVar77 < cVar38);
                      cVar40 = auVar131[10];
                      cVar79 = auVar122[10];
                      auVar118[10] = -(cVar79 < cVar40);
                      cVar43 = auVar131[0xb];
                      cVar80 = auVar122[0xb];
                      auVar118[0xb] = -(cVar80 < cVar43);
                      cVar45 = auVar131[0xc];
                      cVar81 = auVar122[0xc];
                      auVar118[0xc] = -(cVar81 < cVar45);
                      cVar48 = auVar131[0xd];
                      cVar83 = auVar122[0xd];
                      auVar118[0xd] = -(cVar83 < cVar48);
                      cVar50 = auVar131[0xe];
                      cVar84 = auVar122[0xe];
                      cVar52 = auVar131[0xf];
                      auVar118[0xe] = -(cVar84 < cVar50);
                      cVar86 = auVar122[0xf];
                      auVar118[0xf] = -(cVar86 < cVar52);
                      auVar113[0] = -(cVar31 == cVar57);
                      auVar113[1] = -(cVar30 == cVar65);
                      auVar113[2] = -(cVar36 == cVar67);
                      auVar113[3] = -(cVar39 == cVar68);
                      auVar113[4] = -(cVar41 == cVar70);
                      auVar113[5] = -(cVar44 == cVar71);
                      auVar113[6] = -(cVar46 == cVar72);
                      auVar113[7] = -(cVar49 == cVar74);
                      auVar113[8] = -(cVar32 == cVar75);
                      auVar113[9] = -(cVar38 == cVar77);
                      auVar113[10] = -(cVar40 == cVar79);
                      auVar113[0xb] = -(cVar43 == cVar80);
                      auVar113[0xc] = -(cVar45 == cVar81);
                      auVar113[0xd] = -(cVar48 == cVar83);
                      auVar113[0xe] = -(cVar50 == cVar84);
                      auVar113[0xf] = -(cVar52 == cVar86);
                      auVar117[0] = -(-0x80 < cVar31);
                      auVar117[1] = -(-0x80 < cVar30);
                      auVar117[2] = -(-0x80 < cVar36);
                      auVar117[3] = -(-0x80 < cVar39);
                      auVar117[4] = -(-0x80 < cVar41);
                      auVar117[5] = -(-0x80 < cVar44);
                      auVar117[6] = -(-0x80 < cVar46);
                      auVar117[7] = -(-0x80 < cVar49);
                      auVar117[8] = -(-0x80 < cVar32);
                      auVar117[9] = -(-0x80 < cVar38);
                      auVar117[10] = -(-0x80 < cVar40);
                      auVar117[0xb] = -(-0x80 < cVar43);
                      auVar117[0xc] = -(-0x80 < cVar45);
                      auVar117[0xd] = -(-0x80 < cVar48);
                      auVar117[0xe] = -(-0x80 < cVar50);
                      auVar117[0xf] = -(-0x80 < cVar52);
                      auVar118 = auVar117 & auVar113 | auVar118;
                      if ((((((((((((((((auVar118 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar118 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar118 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar118 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar118 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar118 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar118 >> 0x37 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar118 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar118 >> 0x47 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar118 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar118 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar118 >> 0x5f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar118 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar118 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar118 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar118[0xf]) goto LAB_006532fd;
                      auVar62[0] = -(cVar31 < cVar57);
                      auVar62[1] = -(cVar30 < cVar65);
                      auVar62[2] = -(cVar36 < cVar67);
                      auVar62[3] = -(cVar39 < cVar68);
                      auVar62[4] = -(cVar41 < cVar70);
                      auVar62[5] = -(cVar44 < cVar71);
                      auVar62[6] = -(cVar46 < cVar72);
                      auVar62[7] = -(cVar49 < cVar74);
                      auVar62[8] = -(cVar32 < cVar75);
                      auVar62[9] = -(cVar38 < cVar77);
                      auVar62[10] = -(cVar40 < cVar79);
                      auVar62[0xb] = -(cVar43 < cVar80);
                      auVar62[0xc] = -(cVar45 < cVar81);
                      auVar62[0xd] = -(cVar48 < cVar83);
                      auVar62[0xe] = -(cVar50 < cVar84);
                      auVar62[0xf] = -(cVar52 < cVar86);
                      auVar148 = pblendvb(auVar148,auVar116,auVar62);
                      auVar121 = pblendvb(auVar121,auVar130,auVar62);
                      auVar116 = paddsb(auVar127,_DAT_008a1d00);
                      auVar122 = paddsb(auVar120,_DAT_008a1d00);
                      auVar127 = pblendvb(auVar116,auVar122,auVar62);
                      auVar125 = *(undefined1 (*) [16])((long)*palVar21 + lVar17);
                      auVar122 = local_d8;
                    }
                    local_d8 = auVar122;
                  }
LAB_006532fd:
                  cVar32 = local_d8[0];
                  auVar35[0] = -(auVar33[0] < cVar32);
                  cVar38 = local_d8[1];
                  auVar35[1] = -(auVar33[1] < cVar38);
                  cVar40 = local_d8[2];
                  auVar35[2] = -(auVar33[2] < cVar40);
                  cVar43 = local_d8[3];
                  auVar35[3] = -(auVar33[3] < cVar43);
                  cVar45 = local_d8[4];
                  auVar35[4] = -(auVar33[4] < cVar45);
                  cVar48 = local_d8[5];
                  auVar35[5] = -(auVar33[5] < cVar48);
                  cVar50 = local_d8[6];
                  auVar35[6] = -(auVar33[6] < cVar50);
                  cVar52 = local_d8[7];
                  auVar35[7] = -(auVar33[7] < cVar52);
                  cVar39 = local_d8[8];
                  auVar35[8] = -(auVar33[8] < cVar39);
                  cVar31 = local_d8[9];
                  auVar35[9] = -(auVar33[9] < cVar31);
                  cVar30 = local_d8[10];
                  auVar35[10] = -(auVar33[10] < cVar30);
                  cVar36 = local_d8[0xb];
                  auVar35[0xb] = -(auVar33[0xb] < cVar36);
                  cVar41 = local_d8[0xc];
                  auVar35[0xc] = -(auVar33[0xc] < cVar41);
                  cVar44 = local_d8[0xd];
                  auVar35[0xd] = -(auVar33[0xd] < cVar44);
                  cVar46 = local_d8[0xe];
                  cVar49 = local_d8[0xf];
                  auVar35[0xe] = -(auVar33[0xe] < cVar46);
                  bVar7 = auVar33[0xf] < cVar49;
                  auVar35[0xf] = -bVar7;
                  local_1c8 = palVar25;
                  local_1c0 = palVar19;
                  local_1b8 = palVar21;
                  if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar35 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar35 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar35 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar35 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar35 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar35 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar35 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar35 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar35 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar35 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar35 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar35 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar7)
                  {
                    auVar33 = local_d8 ^ _DAT_008a2460;
                    bVar93 = auVar33[0];
                    bVar37 = auVar33[1];
                    auVar63[0] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[1] = 0;
                    bVar93 = auVar33[2];
                    bVar37 = auVar33[3];
                    auVar63[2] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[3] = 0;
                    bVar93 = auVar33[4];
                    bVar37 = auVar33[5];
                    auVar63[4] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[5] = 0;
                    bVar93 = auVar33[6];
                    bVar37 = auVar33[7];
                    auVar63[6] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[7] = 0;
                    bVar93 = auVar33[8];
                    bVar37 = auVar33[9];
                    auVar63[8] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[9] = 0;
                    bVar93 = auVar33[10];
                    bVar37 = auVar33[0xb];
                    auVar63[10] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[0xb] = 0;
                    bVar93 = auVar33[0xc];
                    bVar37 = auVar33[0xd];
                    auVar63[0xc] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[0xd] = 0;
                    bVar93 = auVar33[0xe];
                    bVar37 = auVar33[0xf];
                    auVar63[0xe] = (bVar93 < bVar37) * bVar93 | (bVar93 >= bVar37) * bVar37;
                    auVar63[0xf] = 0;
                    auVar33 = phminposuw(auVar63);
                    local_15c = auVar33._0_4_ ^ 0x7f;
                    if ((char)('~' - local_130) < (char)local_15c) {
                      *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                      palVar12 = palVar13;
                      palVar13 = palVar14;
                      goto LAB_00653474;
                    }
                    bVar93 = (cVar39 < cVar32) * cVar32 | (cVar39 >= cVar32) * cVar39;
                    bVar37 = (cVar31 < cVar38) * cVar38 | (cVar31 >= cVar38) * cVar31;
                    bVar95 = (cVar30 < cVar40) * cVar40 | (cVar30 >= cVar40) * cVar30;
                    bVar42 = (cVar36 < cVar43) * cVar43 | (cVar36 >= cVar43) * cVar36;
                    bVar96 = (cVar41 < cVar45) * cVar45 | (cVar41 >= cVar45) * cVar41;
                    bVar47 = (cVar44 < cVar48) * cVar48 | (cVar44 >= cVar48) * cVar44;
                    bVar97 = (cVar46 < cVar50) * cVar50 | (cVar46 >= cVar50) * cVar46;
                    bVar51 = (cVar49 < cVar52) * cVar52 | (cVar49 >= cVar52) * cVar49;
                    cVar39 = ('\0' < cVar39) * cVar39;
                    cVar31 = ('\0' < cVar31) * cVar31;
                    cVar30 = ('\0' < cVar30) * cVar30;
                    cVar36 = ('\0' < cVar36) * cVar36;
                    cVar41 = ('\0' < cVar41) * cVar41;
                    cVar44 = ('\0' < cVar44) * cVar44;
                    cVar46 = ('\0' < cVar46) * cVar46;
                    cVar49 = ('\0' < cVar49) * cVar49;
                    bVar93 = ((char)bVar96 < (char)bVar93) * bVar93 |
                             ((char)bVar96 >= (char)bVar93) * bVar96;
                    bVar37 = ((char)bVar47 < (char)bVar37) * bVar37 |
                             ((char)bVar47 >= (char)bVar37) * bVar47;
                    bVar95 = ((char)bVar97 < (char)bVar95) * bVar95 |
                             ((char)bVar97 >= (char)bVar95) * bVar97;
                    bVar42 = ((char)bVar51 < (char)bVar42) * bVar42 |
                             ((char)bVar51 >= (char)bVar42) * bVar51;
                    bVar96 = (cVar39 < (char)bVar96) * bVar96 | (cVar39 >= (char)bVar96) * cVar39;
                    bVar47 = (cVar31 < (char)bVar47) * bVar47 | (cVar31 >= (char)bVar47) * cVar31;
                    bVar97 = (cVar30 < (char)bVar97) * bVar97 | (cVar30 >= (char)bVar97) * cVar30;
                    bVar51 = (cVar36 < (char)bVar51) * bVar51 | (cVar36 >= (char)bVar51) * cVar36;
                    bVar53 = (cVar41 < cVar39) * cVar39 | (cVar41 >= cVar39) * cVar41;
                    bVar98 = (cVar44 < cVar31) * cVar31 | (cVar44 >= cVar31) * cVar44;
                    bVar54 = (cVar46 < cVar30) * cVar30 | (cVar46 >= cVar30) * cVar46;
                    bVar99 = (cVar49 < cVar36) * cVar36 | (cVar49 >= cVar36) * cVar49;
                    cVar41 = ('\0' < cVar41) * cVar41;
                    cVar44 = ('\0' < cVar44) * cVar44;
                    cVar46 = ('\0' < cVar46) * cVar46;
                    cVar49 = ('\0' < cVar49) * cVar49;
                    bVar93 = ((char)bVar95 < (char)bVar93) * bVar93 |
                             ((char)bVar95 >= (char)bVar93) * bVar95;
                    bVar37 = ((char)bVar42 < (char)bVar37) * bVar37 |
                             ((char)bVar42 >= (char)bVar37) * bVar42;
                    bVar95 = ((char)bVar96 < (char)bVar95) * bVar95 |
                             ((char)bVar96 >= (char)bVar95) * bVar96;
                    bVar42 = ((char)bVar47 < (char)bVar42) * bVar42 |
                             ((char)bVar47 >= (char)bVar42) * bVar47;
                    bVar96 = ((char)bVar97 < (char)bVar96) * bVar96 |
                             ((char)bVar97 >= (char)bVar96) * bVar97;
                    bVar47 = ((char)bVar51 < (char)bVar47) * bVar47 |
                             ((char)bVar51 >= (char)bVar47) * bVar51;
                    bVar97 = ((char)bVar53 < (char)bVar97) * bVar97 |
                             ((char)bVar53 >= (char)bVar97) * bVar53;
                    bVar51 = ((char)bVar98 < (char)bVar51) * bVar51 |
                             ((char)bVar98 >= (char)bVar51) * bVar98;
                    bVar53 = ((char)bVar54 < (char)bVar53) * bVar53 |
                             ((char)bVar54 >= (char)bVar53) * bVar54;
                    bVar98 = ((char)bVar99 < (char)bVar98) * bVar98 |
                             ((char)bVar99 >= (char)bVar98) * bVar99;
                    bVar54 = (cVar41 < (char)bVar54) * bVar54 | (cVar41 >= (char)bVar54) * cVar41;
                    bVar99 = (cVar44 < (char)bVar99) * bVar99 | (cVar44 >= (char)bVar99) * cVar44;
                    bVar55 = (cVar46 < cVar41) * cVar41 | (cVar46 >= cVar41) * cVar46;
                    bVar100 = (cVar49 < cVar44) * cVar44 | (cVar49 >= cVar44) * cVar49;
                    cVar46 = ('\0' < cVar46) * cVar46;
                    cVar49 = ('\0' < cVar49) * cVar49;
                    auVar64[0] = ((char)bVar37 < (char)bVar93) * bVar93 |
                                 ((char)bVar37 >= (char)bVar93) * bVar37;
                    auVar64[1] = ((char)bVar95 < (char)bVar37) * bVar37 |
                                 ((char)bVar95 >= (char)bVar37) * bVar95;
                    auVar64[2] = ((char)bVar42 < (char)bVar95) * bVar95 |
                                 ((char)bVar42 >= (char)bVar95) * bVar42;
                    auVar64[3] = ((char)bVar96 < (char)bVar42) * bVar42 |
                                 ((char)bVar96 >= (char)bVar42) * bVar96;
                    auVar64[4] = ((char)bVar47 < (char)bVar96) * bVar96 |
                                 ((char)bVar47 >= (char)bVar96) * bVar47;
                    auVar64[5] = ((char)bVar97 < (char)bVar47) * bVar47 |
                                 ((char)bVar97 >= (char)bVar47) * bVar97;
                    auVar64[6] = ((char)bVar51 < (char)bVar97) * bVar97 |
                                 ((char)bVar51 >= (char)bVar97) * bVar51;
                    auVar64[7] = ((char)bVar53 < (char)bVar51) * bVar51 |
                                 ((char)bVar53 >= (char)bVar51) * bVar53;
                    auVar64[8] = ((char)bVar98 < (char)bVar53) * bVar53 |
                                 ((char)bVar98 >= (char)bVar53) * bVar98;
                    auVar64[9] = ((char)bVar54 < (char)bVar98) * bVar98 |
                                 ((char)bVar54 >= (char)bVar98) * bVar54;
                    auVar64[10] = ((char)bVar99 < (char)bVar54) * bVar54 |
                                  ((char)bVar99 >= (char)bVar54) * bVar99;
                    auVar64[0xb] = ((char)bVar55 < (char)bVar99) * bVar99 |
                                   ((char)bVar55 >= (char)bVar99) * bVar55;
                    auVar64[0xc] = ((char)bVar100 < (char)bVar55) * bVar55 |
                                   ((char)bVar100 >= (char)bVar55) * bVar100;
                    auVar64[0xd] = (cVar46 < (char)bVar100) * bVar100 |
                                   (cVar46 >= (char)bVar100) * cVar46;
                    auVar64[0xe] = (cVar49 < cVar46) * cVar46 | (cVar49 >= cVar46) * cVar49;
                    auVar64[0xf] = ('\0' < cVar49) * cVar49;
                    auVar33 = pshufb(auVar64,_DAT_008a1b80);
                    local_168 = uVar18 & 0xffffffff;
                  }
                  uVar18 = uVar18 + 1;
                  local_188._0_8_ = local_140;
                  palVar12 = palVar13;
                  palVar13 = palVar14;
                }
                uVar18 = (ulong)(iVar2 + 1U);
                local_140 = (__m128i *)local_188._0_8_;
                palVar12 = palVar14;
                b = palVar19;
                local_198 = palVar25;
                local_1d0 = palVar21;
LAB_00653474:
                palVar25 = local_1b8;
                palVar19 = local_1c0;
                palVar14 = local_1d0;
                if (((char)local_15c == '\x7f') ||
                   (auVar111[0] = -(local_158[0] == '\x7f'), auVar111[1] = -(local_158[1] == '\x7f')
                   , auVar111[2] = -(local_158[2] == '\x7f'),
                   auVar111[3] = -(local_158[3] == '\x7f'), auVar111[4] = -(local_158[4] == '\x7f'),
                   auVar111[5] = -(local_158[5] == '\x7f'), auVar111[6] = -(local_158[6] == '\x7f'),
                   auVar111[7] = -(local_158[7] == '\x7f'), auVar111[8] = -(local_158[8] == '\x7f'),
                   auVar111[9] = -(local_158[9] == '\x7f'),
                   auVar111[10] = -(local_158[10] == '\x7f'),
                   auVar111[0xb] = -(local_158[0xb] == '\x7f'),
                   auVar111[0xc] = -(local_158[0xc] == '\x7f'),
                   auVar111[0xd] = -(local_158[0xd] == '\x7f'),
                   auVar111[0xe] = -(local_158[0xe] == '\x7f'), bVar7 = local_158[0xf] == '\x7f',
                   auVar111[0xf] = -bVar7,
                   (((((((((((((((auVar111 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                (auVar111 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar111 >> 0x17 & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar111 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar111 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar111 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                          || (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar111 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar111 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar111 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar111 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar111 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar111 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar7)) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
                iVar10 = parasail_result_is_saturated(result_00);
                palVar21 = palVar12;
                palVar28 = local_198;
                palVar29 = palVar13;
                if (iVar10 == 0) {
                  if ((int)local_168 == (int)uVar18 + -1) {
                    local_1d0 = local_1a0;
                    palVar19 = b;
                    palVar21 = local_140;
                    local_1a0 = palVar14;
                    b = local_1a8;
                    palVar28 = local_1b0;
                    local_188._0_8_ = palVar12;
                  }
                  else if ((int)local_168 == (int)uVar18 + -2) {
                    local_198 = local_1c8;
                    local_1c8 = local_1b0;
                    local_1c0 = local_1a8;
                    local_1b8 = local_1a0;
                    local_1a0 = palVar25;
                    palVar29 = local_140;
                    local_188._0_8_ = palVar13;
                  }
                  else {
                    local_188._0_8_ = local_140;
                    local_198 = local_1b0;
                    palVar19 = local_1a8;
                  }
                  cVar36 = -0x80;
                  uVar20 = 0;
                  cVar30 = -0x80;
                  cVar31 = -0x80;
                  while( true ) {
                    iVar10 = (int)uVar11;
                    if ((uVar8 & 0x7ffffff) << 4 == (uint)uVar20) break;
                    if ((*(char *)((long)*local_1a0 + uVar20) == (char)local_15c) &&
                       (uVar16 = ((uint)uVar20 & 0xf) * uVar8 + ((uint)(uVar20 >> 4) & 0xfffffff),
                       (int)uVar16 < iVar10)) {
                      cVar31 = *(char *)((long)*palVar19 + uVar20);
                      cVar30 = *(char *)((long)*local_198 + uVar20);
                      cVar36 = *(char *)((long)(longlong *)local_188._0_8_ + uVar20);
                      uVar11 = (ulong)uVar16;
                    }
                    uVar20 = uVar20 + 1;
                  }
                  iVar26 = (char)local_15c + 0x80;
                  iVar23 = cVar31 + 0x80;
                  iVar22 = cVar30 + 0x80;
                  iVar24 = cVar36 + 0x80;
                  local_1b0 = local_198;
                  local_140 = (__m128i *)local_188._0_8_;
                  local_1a8 = palVar19;
                }
                else {
                  local_168._0_4_ = 0;
                  iVar24 = 0x80;
                  iVar22 = 0x80;
                  iVar23 = 0x80;
                  iVar26 = 0x80;
                  iVar10 = 0;
                }
                result_00->score = iVar26;
                result_00->end_query = iVar10;
                result_00->end_ref = (int)local_168;
                ((result_00->field_4).stats)->matches = iVar23;
                ((result_00->field_4).stats)->similar = iVar22;
                ((result_00->field_4).stats)->length = iVar24;
                parasail_free(local_140);
                parasail_free(local_1b0);
                parasail_free(local_1a8);
                parasail_free(local_1a0);
                parasail_free(b_03);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(palVar29);
                parasail_free(palVar21);
                parasail_free(local_1c8);
                parasail_free(palVar28);
                parasail_free(local_1c0);
                parasail_free(b);
                parasail_free(local_1b8);
                parasail_free(local_1d0);
              }
              else {
                result_00 = (parasail_result_t *)0x0;
              }
            }
            goto LAB_006537ef;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "gap";
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
  fprintf(_stderr,__format,"parasail_sw_stats_striped_profile_sse41_128_8_internal",pcVar15);
LAB_006537ef:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar9;
  result_00->end_ref = iVar2;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse41_128_8(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_8(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse41_128_8(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_8(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_8(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}